

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O2

ArrayBufferDetachedStateBase * __thiscall
Js::ArrayBuffer::DetachAndGetState(ArrayBuffer *this,bool queueForDelayFree)

{
  ThreadContext *pTVar1;
  RefCountedBuffer *pRVar2;
  BasePtr<Js::ArrayBufferDetachedStateBase> BVar3;
  int iVar4;
  undefined4 extraout_var;
  ArrayBufferDetachedStateBase *pAVar5;
  undefined4 extraout_var_00;
  BasePtr<Js::ArrayBufferDetachedStateBase> local_28;
  AutoPtr<Js::ArrayBufferDetachedStateBase,_Memory::HeapAllocator> arrayBufferState;
  
  iVar4 = (*(this->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x78])
                    (this,this->bufferContent,(ulong)this->bufferLength);
  local_28.ptr = (ArrayBufferDetachedStateBase *)CONCAT44(extraout_var,iVar4);
  Detach(this);
  if (queueForDelayFree) {
    pAVar5 = BasePtr<Js::ArrayBufferDetachedStateBase>::operator->(&local_28);
    if (pAVar5->buffer != (RefCountedBuffer *)0x0) {
      pTVar1 = ((((((this->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.type.
                   ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
               threadContext;
      pAVar5 = BasePtr<Js::ArrayBufferDetachedStateBase>::operator->(&local_28);
      pRVar2 = pAVar5->buffer;
      pAVar5 = BasePtr<Js::ArrayBufferDetachedStateBase>::operator->(&local_28);
      iVar4 = (*(this->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x76])(this,pRVar2,(ulong)pAVar5->bufferLength);
      DelayedFreeArrayBuffer::Push
                (&pTVar1->delayFreeCallback,
                 (ArrayBufferContentForDelayedFreeBase *)CONCAT44(extraout_var_00,iVar4));
    }
  }
  BVar3.ptr = local_28.ptr;
  local_28.ptr = (ArrayBufferDetachedStateBase *)0x0;
  AutoPtr<Js::ArrayBufferDetachedStateBase,_Memory::HeapAllocator>::~AutoPtr
            ((AutoPtr<Js::ArrayBufferDetachedStateBase,_Memory::HeapAllocator> *)&local_28);
  return BVar3.ptr;
}

Assistant:

ArrayBufferDetachedStateBase* ArrayBuffer::DetachAndGetState(bool queueForDelayFree/* = true*/)
    {
        // Save the state before detaching
        AutoPtr<ArrayBufferDetachedStateBase> arrayBufferState(this->CreateDetachedState(this->bufferContent, this->bufferLength));
        Detach();

        // Now put this bufferContent to the queue so that we can manage the lifetime of the buffer later.
        if (queueForDelayFree && arrayBufferState->buffer != nullptr)
        {
            DelayedFreeArrayBuffer * local = GetScriptContext()->GetThreadContext()->GetScanStackCallback();
            local->Push(this->CopyBufferContentForDelayedFree(arrayBufferState->buffer, arrayBufferState->bufferLength));
        }

        return arrayBufferState.Detach();
    }